

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar1;
  uint uVar2;
  uint32_t id;
  ulong uVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  pVar4;
  size_t sVar5;
  long lVar6;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  bool bVar8;
  mapped_type *name;
  mapped_type *pmVar9;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> TVar10;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar12;
  uint uVar13;
  TypedID<(spirv_cross::Types)0> *pTVar14;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__i;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar15;
  string initializer;
  __hashtable *__h_1;
  __hashtable *__h;
  undefined1 local_d0 [32];
  char local_b0 [4];
  undefined4 uStack_ac;
  undefined1 local_a0 [16];
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_68;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_60;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  long local_40;
  char *local_38;
  
  uVar3 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (uVar3 != 0) {
    ppVar12 = (temporaries->
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              ).ptr;
    ppVar1 = ppVar12 + uVar3;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    ::std::
    __introsort_loop<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
              (ppVar12,ppVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar3 < 0x11) {
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar12,ppVar1);
    }
    else {
      ppVar15 = ppVar12 + 0x10;
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar12,ppVar15);
      pTVar14 = &ppVar12[0x10].second;
      do {
        pVar4 = *ppVar15;
        uVar13 = ppVar15[-1].second.id;
        TVar10 = pVar4.second.id;
        ppVar12 = ppVar15;
        pTVar7 = pTVar14;
        if (TVar10.id < uVar13) {
          do {
            pTVar11 = pTVar7;
            uVar2 = pTVar11[-4].id;
            (((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
               *)(pTVar11 + -1))->first).id = pTVar11[-3].id;
            pTVar11->id = uVar13;
            pTVar7 = pTVar11 + -2;
            uVar13 = uVar2;
          } while (TVar10.id < uVar2);
          ppVar12 = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                     *)(pTVar11 + -3);
        }
        (ppVar12->first).id = pVar4.first.id.id;
        (ppVar12->second).id = TVar10.id;
        ppVar15 = ppVar15 + 1;
        pTVar14 = pTVar14 + 2;
      } while (ppVar15 != ppVar1);
    }
  }
  sVar5 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (sVar5 != 0) {
    local_48 = &this->local_variable_names;
    local_50 = &this->block_names;
    local_58 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_Compiler).ir.meta;
    local_60 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&(this->super_Compiler).hoisted_temporaries;
    local_68 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&(this->super_Compiler).forced_temporaries;
    pTVar14 = &((temporaries->
                super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                ).ptr)->second;
    local_40 = sVar5 << 3;
    do {
      this_00 = local_58;
      local_90 = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                  *)(pTVar14 + -1);
      local_88._M_dataplus._M_p._0_4_ = pTVar14->id;
      name = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_58,(key_type *)&local_88);
      add_variable(this,local_48,local_50,(string *)name);
      pmVar9 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](this_00,pTVar14);
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                           *)(pTVar14 + -1))->first).id);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      if (((this->options).force_zero_initialized_variables == true) &&
         (bVar8 = type_can_zero_initialize(this,type), bVar8)) {
        (*(this->super_Compiler)._vptr_Compiler[0x33])(&local_b0,this,(ulong)(local_90->first).id);
        join<char_const(&)[4],std::__cxx11::string>
                  ((string *)local_d0,(spirv_cross *)0x2f7937,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
        ::std::__cxx11::string::operator=((string *)&local_88,(string *)local_d0);
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_d0._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_);
        }
        if ((undefined1 *)CONCAT44(uStack_ac,local_b0) != local_a0) {
          operator_delete((undefined1 *)CONCAT44(uStack_ac,local_b0));
        }
      }
      local_38 = flags_to_qualifiers_glsl(this,type,&(pmVar9->decoration).decoration_flags);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_b0,this,(ulong)pTVar14->id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1a])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,this,
                 type,local_b0,0);
      statement<char_const*,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 &local_88,(char (*) [2])0x2ddbde);
      if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)local_d0._0_8_ !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((undefined1 *)CONCAT44(uStack_ac,local_b0) != local_a0) {
        operator_delete((undefined1 *)CONCAT44(uStack_ac,local_b0));
      }
      local_b0 = (char  [4])pTVar14->id;
      local_d0._0_8_ = local_60;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_60,local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      local_b0 = (char  [4])pTVar14->id;
      local_d0._0_8_ = local_68;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_68,local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      id = pTVar14->id;
      (*(this->super_Compiler)._vptr_Compiler[6])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,this,
                 (ulong)pTVar14->id,1);
      local_b0[0] = '\x01';
      Compiler::
      set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                (&this->super_Compiler,id,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 &local_90->first,(bool *)local_b0);
      if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)local_d0._0_8_ !=
          (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      pTVar14 = pTVar14 + 2;
      local_40 = local_40 + -8;
    } while (local_40 != 0);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		add_local_variable_name(tmp.second);
		auto &flags = ir.meta[tmp.second].decoration.decoration_flags;
		auto &type = get<SPIRType>(tmp.first);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);
	}
}